

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmValue __thiscall
cmGeneratorTarget::GetFeature(cmGeneratorTarget *this,string *feature,string *config)

{
  cmValue cVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string featureConfig;
  string local_e0;
  string local_c0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  string *local_28;
  
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_c0,config);
    local_68.first._M_str = (feature->_M_dataplus)._M_p;
    local_68.first._M_len = feature->_M_string_length;
    local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90 = local_88;
    local_a0 = 0;
    local_98 = 1;
    local_88[0] = 0x5f;
    local_50 = 1;
    local_40 = 0;
    local_38 = local_c0._M_string_length;
    local_30 = local_c0._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_68;
    local_48 = local_90;
    local_28 = &local_c0;
    cmCatViews(&local_e0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    cVar1 = GetProperty(this,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (cVar1.Value != (string *)0x0) {
      return (cmValue)cVar1.Value;
    }
  }
  cVar1 = GetProperty(this,feature);
  if (cVar1.Value == (string *)0x0) {
    cVar1 = cmLocalGenerator::GetFeature(this->LocalGenerator,feature,config);
  }
  return (cmValue)cVar1.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFeature(const std::string& feature,
                                      const std::string& config) const
{
  if (!config.empty()) {
    std::string featureConfig =
      cmStrCat(feature, '_', cmSystemTools::UpperCase(config));
    if (cmValue value = this->GetProperty(featureConfig)) {
      return value;
    }
  }
  if (cmValue value = this->GetProperty(feature)) {
    return value;
  }
  return this->LocalGenerator->GetFeature(feature, config);
}